

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_transaction.cpp
# Opt level: O0

void __thiscall
Transaction_RollbackAfterAppending4mb_Test::TestBody
          (Transaction_RollbackAfterAppending4mb_Test *this)

{
  bool bVar1;
  int iVar2;
  storage *psVar3;
  region_container *this_00;
  undefined4 extraout_var;
  Message *pMVar4;
  char *pcVar5;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  mock_database *this_01;
  AssertHelper local_140;
  Message local_138;
  unsigned_long local_130;
  undefined1 local_128 [8];
  AssertionResult gtest_ar_3;
  Message local_110;
  size_type local_108;
  undefined1 local_100 [8];
  AssertionResult gtest_ar_2;
  Message local_e8;
  unsigned_long local_e0;
  undefined1 local_d8 [8];
  AssertionResult gtest_ar_1;
  Message local_c0;
  size_type local_b8;
  undefined1 local_b0 [8];
  AssertionResult gtest_ar;
  unique_lock<mock_mutex> local_88;
  undefined1 local_78 [8];
  transaction<std::unique_lock<mock_mutex>_> transaction;
  size_type sStack_38;
  uint bytes_to_allocate;
  size_t original_num_regions;
  uint64_t original_size;
  file_base *pfStack_20;
  mock_mutex mutex;
  file_base *file;
  region_container *regions;
  Transaction_RollbackAfterAppending4mb_Test *this_local;
  
  this_01 = &(this->super_Transaction).db_;
  psVar3 = pstore::database::storage(&this_01->super_database);
  this_00 = pstore::storage::regions(psVar3);
  psVar3 = pstore::database::storage(&this_01->super_database);
  pfStack_20 = pstore::storage::file(psVar3);
  iVar2 = (*pfStack_20->_vptr_file_base[9])();
  original_num_regions = CONCAT44(extraout_var,iVar2);
  sStack_38 = std::
              vector<std::shared_ptr<pstore::memory_mapper_base>,_std::allocator<std::shared_ptr<pstore::memory_mapper_base>_>_>
              ::size(this_00);
  transaction.lock_._12_4_ = 0x400000;
  std::unique_lock<mock_mutex>::unique_lock(&local_88,(mutex_type *)((long)&original_size + 7));
  ::begin((transaction<std::unique_lock<mock_mutex>_> *)local_78,&this_01->super_database,&local_88)
  ;
  std::unique_lock<mock_mutex>::~unique_lock(&local_88);
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )pstore::transaction_base::allocate((transaction_base *)local_78,0x400000,1);
  local_b8 = std::
             vector<std::shared_ptr<pstore::memory_mapper_base>,_std::allocator<std::shared_ptr<pstore::memory_mapper_base>_>_>
             ::size(this_00);
  testing::internal::CmpHelperGT<unsigned_long,unsigned_long>
            ((internal *)local_b0,"regions.size ()","original_num_regions",&local_b8,
             &stack0xffffffffffffffc8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b0);
  if (!bVar1) {
    testing::Message::Message(&local_c0);
    pMVar4 = testing::Message::operator<<
                       (&local_c0,(char (*) [32])"Allocate did not create regions");
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_b0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_transaction.cpp"
               ,0x160,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,pMVar4);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b0);
  iVar2 = (*pfStack_20->_vptr_file_base[9])();
  local_e0 = CONCAT44(extraout_var_00,iVar2);
  testing::internal::CmpHelperGT<unsigned_long,unsigned_long>
            ((internal *)local_d8,"file->size ()","original_size",&local_e0,&original_num_regions);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d8);
  if (!bVar1) {
    testing::Message::Message(&local_e8);
    pMVar4 = testing::Message::operator<<(&local_e8,(char (*) [23])"The file did not grow!");
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_d8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_transaction.cpp"
               ,0x161,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,pMVar4);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_d8);
  pstore::transaction_base::rollback((transaction_base *)local_78);
  local_108 = std::
              vector<std::shared_ptr<pstore::memory_mapper_base>,_std::allocator<std::shared_ptr<pstore::memory_mapper_base>_>_>
              ::size(this_00);
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
            ((EqHelper *)local_100,"regions.size ()","original_num_regions",&local_108,
             &stack0xffffffffffffffc8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_100);
  if (!bVar1) {
    testing::Message::Message(&local_110);
    pMVar4 = testing::Message::operator<<
                       (&local_110,(char (*) [33])"Rollback did not reclaim regions");
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_100);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_transaction.cpp"
               ,0x165,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,pMVar4);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_110);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_100);
  iVar2 = (*pfStack_20->_vptr_file_base[9])();
  local_130 = CONCAT44(extraout_var_01,iVar2);
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
            ((EqHelper *)local_128,"file->size ()","original_size",&local_130,&original_num_regions)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_128);
  if (!bVar1) {
    testing::Message::Message(&local_138);
    pMVar4 = testing::Message::operator<<
                       (&local_138,(char (*) [47])"The file was not restored to its original size");
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_128);
    testing::internal::AssertHelper::AssertHelper
              (&local_140,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_transaction.cpp"
               ,0x166,pcVar5);
    testing::internal::AssertHelper::operator=(&local_140,pMVar4);
    testing::internal::AssertHelper::~AssertHelper(&local_140);
    testing::Message::~Message(&local_138);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_128);
  pstore::transaction<std::unique_lock<mock_mutex>_>::~transaction
            ((transaction<std::unique_lock<mock_mutex>_> *)local_78);
  return;
}

Assistant:

TEST_F (Transaction, RollbackAfterAppending4mb) {
    pstore::storage::region_container const & regions = db_.storage ().regions ();
    pstore::file::file_base * const file = db_.storage ().file ();

    mock_mutex mutex;
    std::uint64_t const original_size = file->size ();
    std::size_t const original_num_regions = regions.size ();
    constexpr auto bytes_to_allocate = 4U * 1024U * 1024U;

    auto transaction = begin (db_, std::unique_lock<mock_mutex>{mutex});

    transaction.allocate (bytes_to_allocate, 1 /*align*/);
    EXPECT_GT (regions.size (), original_num_regions) << "Allocate did not create regions";
    EXPECT_GT (file->size (), original_size) << "The file did not grow!";

    // Abandon the transaction.
    transaction.rollback ();
    EXPECT_EQ (regions.size (), original_num_regions) << "Rollback did not reclaim regions";
    EXPECT_EQ (file->size (), original_size) << "The file was not restored to its original size";
}